

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O3

vector<CBlockHeader,_std::allocator<CBlockHeader>_> * __thiscall
HeadersSyncState::PopHeadersReadyForAcceptance
          (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *__return_storage_ptr__,
          HeadersSyncState *this)

{
  _Map_pointer ppCVar1;
  _Elt_pointer pCVar2;
  iterator __position;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  CBlockHeader *pCVar8;
  iterator iVar9;
  long in_FS_OFFSET;
  byte bVar10;
  CBlockHeader ret;
  CBlockHeader local_88;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_download_state == REDOWNLOAD) {
    while( true ) {
      ppCVar1 = (this->m_redownloaded_headers).
                super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      pCVar2 = (this->m_redownloaded_headers).
               super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      uVar6 = ((long)(this->m_redownloaded_headers).
                     super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                     super__Deque_impl_data._M_start._M_last - (long)pCVar2 >> 4) *
              -0x5555555555555555 +
              ((long)(this->m_redownloaded_headers).
                     super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur -
               (long)(this->m_redownloaded_headers).
                     super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
              (((long)ppCVar1 -
                (long)(this->m_redownloaded_headers).
                      super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl
                      .super__Deque_impl_data._M_start._M_node >> 3) + -1 +
              (ulong)(ppCVar1 == (_Map_pointer)0x0)) * 10;
      if ((uVar6 < 0x391e) && ((uVar6 == 0 || (this->m_process_all_remaining_headers != true))))
      break;
      local_88.nVersion = pCVar2->nVersion;
      uVar3 = *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               8);
      uVar4 = *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               0x10);
      uVar5 = *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               0x18);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._16_4_ = SUB84(uVar4,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_4_ =
           SUB84((ulong)uVar4 >> 0x20,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._24_4_ = SUB84(uVar5,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._28_4_ =
           SUB84((ulong)uVar5 >> 0x20,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)
            (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems;
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._8_4_ = SUB84(uVar3,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_4_ =
           SUB84((ulong)uVar3 >> 0x20,0);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((pCVar2->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((pCVar2->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(pCVar2->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems;
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((pCVar2->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8);
      local_88.nTime = pCVar2->nTime;
      local_88.nBits = pCVar2->nBits;
      local_88.nNonce = pCVar2->nNonce;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::_M_realloc_insert<CBlockHeader>
                  (__return_storage_ptr__,__position,&local_88);
      }
      else {
        pCVar8 = &local_88;
        iVar9._M_current = __position._M_current;
        for (lVar7 = 0x14; lVar7 != 0; lVar7 = lVar7 + -1) {
          (iVar9._M_current)->nVersion = pCVar8->nVersion;
          pCVar8 = (CBlockHeader *)((long)pCVar8 + (ulong)bVar10 * -8 + 4);
          iVar9._M_current = iVar9._M_current + (ulong)bVar10 * -8 + 4;
        }
        (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::pop_front
                (&this->m_redownloaded_headers);
      CBlockHeader::GetHash
                ((uint256 *)&local_88,
                 (__return_storage_ptr__->
                 super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1);
      *(ulong *)((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
                0x10) =
           CONCAT44(local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._16_4_,
                    local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_4_);
      *(ulong *)((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
                0x18) =
           CONCAT44(local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._24_4_,
                    local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_4_);
      *(int32_t *)(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems
           = local_88.nVersion;
      *(undefined4 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 4) =
           local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_4_;
      *(undefined4 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 8) =
           local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_4_;
      *(undefined4 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0xc) =
           local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._8_4_;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CBlockHeader> HeadersSyncState::PopHeadersReadyForAcceptance()
{
    std::vector<CBlockHeader> ret;

    Assume(m_download_state == State::REDOWNLOAD);
    if (m_download_state != State::REDOWNLOAD) return ret;

    while (m_redownloaded_headers.size() > REDOWNLOAD_BUFFER_SIZE ||
            (m_redownloaded_headers.size() > 0 && m_process_all_remaining_headers)) {
        ret.emplace_back(m_redownloaded_headers.front().GetFullHeader(m_redownload_buffer_first_prev_hash));
        m_redownloaded_headers.pop_front();
        m_redownload_buffer_first_prev_hash = ret.back().GetHash();
    }
    return ret;
}